

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenubar.cpp
# Opt level: O0

void __thiscall QDBusMenuBar::registerMenuBar(QDBusMenuBar *this)

{
  QFlags_conflict *pQVar1;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  bool bVar2;
  undefined4 uVar3;
  int iVar4;
  ulong uVar5;
  WId WVar6;
  char *pcVar7;
  char *pcVar8;
  QPlatformIntegration *pQVar9;
  undefined4 extraout_var;
  long *plVar10;
  QWindow *pQVar11;
  QObject *pQVar12;
  char *in_RDI;
  long in_FS_OFFSET;
  QDesktopUnixServices *unixServices;
  char16_t *str;
  QDBusPendingReply<> r;
  QDBusMenuRegistrarInterface registrar;
  QDBusConnection connection;
  undefined4 in_stack_fffffffffffffd58;
  RegisterOption in_stack_fffffffffffffd5c;
  QDBusError *in_stack_fffffffffffffd60;
  QWindow *in_stack_fffffffffffffd68;
  QObject *in_stack_fffffffffffffd70;
  QDBusConnection *in_stack_fffffffffffffd78;
  QString *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd90;
  uint uVar13;
  uint uVar14;
  uint windowId;
  undefined1 local_200 [88];
  QString local_1a8 [4];
  QString local_138 [2];
  char local_108 [56];
  undefined1 *local_d0;
  undefined1 *local_98;
  undefined1 *local_90;
  QLatin1StringView local_88;
  QChar local_5a;
  QArrayDataPointer<char16_t> local_58 [3];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDBusConnection::sessionBus();
  windowId = 0;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_58,(Data *)0x0,L"/MenuBar/%1",0xb);
  QString::QString((QString *)in_stack_fffffffffffffd60,
                   (DataPointer *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  registerMenuBar::menuBarId = registerMenuBar::menuBarId + 1;
  uVar14 = registerMenuBar::menuBarId;
  QChar::QChar<char16_t,_true>(&local_5a,L' ');
  QString::arg<unsigned_int,_true>
            ((QString *)in_stack_fffffffffffffd68,(uint)((ulong)in_stack_fffffffffffffd60 >> 0x20),
             (int)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
             (QChar)(char16_t)((ulong)in_stack_fffffffffffffd78 >> 0x30));
  QString::operator=((QString *)in_stack_fffffffffffffd60,
                     (QString *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  QString::~QString((QString *)0xaee111);
  QString::~QString((QString *)0xaee11e);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffd60);
  pQVar12 = (QObject *)(in_RDI + 0x38);
  pQVar1 = *(QFlags_conflict **)(in_RDI + 0x10);
  QFlags<QDBusConnection::RegisterOption>::QFlags
            ((QFlags<QDBusConnection::RegisterOption> *)in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd5c);
  uVar5 = QDBusConnection::registerObject((QString *)&local_10,pQVar12,pQVar1);
  if ((uVar5 & 1) != 0) {
    QGuiApplication::platformName();
    local_88 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffffd68,(size_t)in_stack_fffffffffffffd60);
    bVar2 = ::operator==((QString *)in_stack_fffffffffffffd68,
                         (QLatin1StringView *)in_stack_fffffffffffffd60);
    uVar13 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd90);
    QString::~QString((QString *)0xaee1dd);
    if ((uVar13 & 0x1000000) != 0) {
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      local_90 = &DAT_aaaaaaaaaaaaaaaa;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffd68,(size_t)in_stack_fffffffffffffd60);
      latin1.m_size._4_4_ = uVar14;
      latin1.m_size._0_4_ = uVar13;
      latin1.m_data = in_RDI;
      QString::QString((QString *)in_stack_fffffffffffffd70,latin1);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffd68,(size_t)in_stack_fffffffffffffd60);
      latin1_00.m_size._4_4_ = uVar14;
      latin1_00.m_size._0_4_ = uVar13;
      latin1_00.m_data = in_RDI;
      QString::QString((QString *)in_stack_fffffffffffffd70,latin1_00);
      QDBusMenuRegistrarInterface::QDBusMenuRegistrarInterface
                ((QDBusMenuRegistrarInterface *)CONCAT44(uVar14,uVar13),
                 (QString *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      QString::~QString((QString *)0xaee2a3);
      QString::~QString((QString *)0xaee2b0);
      local_d0 = &DAT_aaaaaaaaaaaaaaaa;
      QPointer<QWindow>::operator->((QPointer<QWindow> *)0xaee2cd);
      WVar6 = QWindow::winId(in_stack_fffffffffffffd68);
      uVar3 = (undefined4)WVar6;
      QDBusObjectPath::QDBusObjectPath
                ((QDBusObjectPath *)in_stack_fffffffffffffd60,
                 (QString *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      QDBusMenuRegistrarInterface::RegisterWindow
                ((QDBusMenuRegistrarInterface *)CONCAT44(uVar3,in_stack_fffffffffffffd88),windowId,
                 (QDBusObjectPath *)in_stack_fffffffffffffd80);
      QDBusObjectPath::~QDBusObjectPath((QDBusObjectPath *)0xaee31d);
      QDBusPendingCall::waitForFinished();
      uVar5 = QDBusPendingCall::isError();
      bVar2 = (uVar5 & 1) != 0;
      if (bVar2) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,
                   (int)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
        QDBusPendingCall::error();
        QDBusError::name();
        QtPrivate::asString(local_138);
        QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
        pcVar7 = QByteArray::constData((QByteArray *)0xaee3aa);
        QDBusPendingCall::error();
        QDBusError::message();
        QtPrivate::asString(local_1a8);
        QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
        pcVar8 = QByteArray::constData((QByteArray *)0xaee403);
        QMessageLogger::warning
                  (local_108,"Failed to register window menu, reason: %s (\"%s\")",pcVar7,pcVar8);
        QByteArray::~QByteArray((QByteArray *)0xaee42e);
        QString::~QString((QString *)0xaee43b);
        QDBusError::~QDBusError(in_stack_fffffffffffffd60);
        QByteArray::~QByteArray((QByteArray *)0xaee455);
        QString::~QString((QString *)0xaee462);
        QDBusError::~QDBusError(in_stack_fffffffffffffd60);
        QDBusConnection::unregisterObject(&local_10,in_RDI + 0x38,0);
      }
      QDBusPendingReply<>::~QDBusPendingReply((QDBusPendingReply<> *)0xaee4ac);
      QDBusMenuRegistrarInterface::~QDBusMenuRegistrarInterface
                ((QDBusMenuRegistrarInterface *)0xaee4b9);
      if (bVar2) goto LAB_00aee589;
    }
    pQVar9 = QGuiApplicationPrivate::platformIntegration();
    iVar4 = (*pQVar9->_vptr_QPlatformIntegration[0x13])();
    if (CONCAT44(extraout_var,iVar4) == 0) {
      plVar10 = (long *)0x0;
    }
    else {
      plVar10 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar4),&QPlatformServices::typeinfo,
                                       &QDesktopUnixServices::typeinfo,0);
    }
    pQVar11 = ::QPointer::operator_cast_to_QWindow_((QPointer<QWindow> *)0xaee536);
    QDBusConnection::baseService();
    (**(code **)(*plVar10 + 0x40))(plVar10,pQVar11,local_200,in_RDI + 0x38);
    QString::~QString((QString *)0xaee57e);
  }
LAB_00aee589:
  QDBusConnection::~QDBusConnection((QDBusConnection *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusMenuBar::registerMenuBar()
{
    static uint menuBarId = 0;

    QDBusConnection connection = QDBusConnection::sessionBus();
    m_objectPath = QStringLiteral("/MenuBar/%1").arg(++menuBarId);
    if (!connection.registerObject(m_objectPath, m_menu))
        return;

    if (QGuiApplication::platformName() == "xcb"_L1) {
        QDBusMenuRegistrarInterface registrar(REGISTRAR_SERVICE, REGISTRAR_PATH, connection, this);
        QDBusPendingReply<> r = registrar.RegisterWindow(m_window->winId(), QDBusObjectPath(m_objectPath));
        r.waitForFinished();
        if (r.isError()) {
            qWarning("Failed to register window menu, reason: %s (\"%s\")",
                     qUtf8Printable(r.error().name()), qUtf8Printable(r.error().message()));
            connection.unregisterObject(m_objectPath);
            return;
        }
    }

    const auto unixServices = dynamic_cast<QDesktopUnixServices *>(
            QGuiApplicationPrivate::platformIntegration()->services());
    unixServices->registerDBusMenuForWindow(m_window, connection.baseService(), m_objectPath);
}